

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[130],capnp::_::(anonymous_namespace)::UnionState,capnp::_::(anonymous_namespace)::UnionState>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [130],
               UnionState *params_1,UnionState *params_2)

{
  undefined4 in_register_00000014;
  UnionState *params_00;
  UnionState *params_01;
  long lVar1;
  String argValues [3];
  
  str<char_const(&)[130]>
            (argValues,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [130])CONCAT44(in_register_00000014,severity));
  str<capnp::_::(anonymous_namespace)::UnionState&>(argValues + 1,(kj *)macroArgs,params_00);
  str<capnp::_::(anonymous_namespace)::UnionState&>(argValues + 2,(kj *)params,params_01);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,line,(char *)argValues,
              (ArrayPtr<kj::String>)argValues[0].content._0_16_);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}